

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O1

int satoko_add_variable(solver_t *s,char sign)

{
  uint uVar1;
  uint entry;
  vec_wl_t *pvVar2;
  vec_act_t *pvVar3;
  vec_uint_t *pvVar4;
  vec_char_t *pvVar5;
  watch_list *pwVar6;
  sdbl_t *psVar7;
  uint *puVar8;
  char *pcVar9;
  char *__file;
  uint uVar10;
  size_t sVar11;
  
  pvVar2 = s->watches;
  entry = s->activity->size;
  uVar10 = pvVar2->cap;
  if (pvVar2->size == uVar10) {
    uVar1 = (uVar10 >> 1) * 3;
    if (uVar10 < 4) {
      uVar1 = uVar10 * 2;
    }
    pwVar6 = (watch_list *)realloc(pvVar2->watch_lists,(ulong)uVar1 * 0x18);
    pvVar2->watch_lists = pwVar6;
    uVar10 = pvVar2->cap;
    memset(pwVar6 + uVar10,0,(ulong)(uVar1 - uVar10) * 0x18);
    if (pwVar6 == (watch_list *)0x0) {
      printf("failed to realloc memory from %.1f mb to %.1f mb.\n",
             (double)uVar10 * 9.5367431640625e-07,(double)uVar1 * 9.5367431640625e-07);
      fflush(_stdout);
    }
    pvVar2->cap = uVar1;
  }
  pvVar2->size = pvVar2->size + 1;
  pvVar2 = s->watches;
  uVar10 = pvVar2->cap;
  if (pvVar2->size == uVar10) {
    uVar1 = (uVar10 >> 1) * 3;
    if (uVar10 < 4) {
      uVar1 = uVar10 * 2;
    }
    pwVar6 = (watch_list *)realloc(pvVar2->watch_lists,(ulong)uVar1 * 0x18);
    pvVar2->watch_lists = pwVar6;
    uVar10 = pvVar2->cap;
    memset(pwVar6 + uVar10,0,(ulong)(uVar1 - uVar10) * 0x18);
    if (pwVar6 == (watch_list *)0x0) {
      printf("failed to realloc memory from %.1f mb to %.1f mb.\n",
             (double)uVar10 * 9.5367431640625e-07,(double)uVar1 * 9.5367431640625e-07);
      fflush(_stdout);
    }
    pvVar2->cap = uVar1;
  }
  pvVar2->size = pvVar2->size + 1;
  pvVar3 = s->activity;
  uVar10 = pvVar3->cap;
  if (pvVar3->size == uVar10) {
    if (uVar10 < 0x10) {
      psVar7 = (sdbl_t *)realloc(pvVar3->data,0x80);
      pvVar3->data = psVar7;
      uVar10 = 0x10;
      if (psVar7 == (sdbl_t *)0x0) {
LAB_005553c6:
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_sdbl.h"
        ;
        pcVar9 = "void vec_sdbl_reserve(vec_sdbl_t *, unsigned int)";
        goto LAB_005553db;
      }
    }
    else {
      if ((int)uVar10 < 1) goto LAB_00555062;
      psVar7 = (sdbl_t *)realloc(pvVar3->data,(ulong)uVar10 << 4);
      pvVar3->data = psVar7;
      if (psVar7 == (sdbl_t *)0x0) goto LAB_005553c6;
      uVar10 = uVar10 * 2;
    }
    pvVar3->cap = uVar10;
  }
LAB_00555062:
  uVar10 = pvVar3->size;
  pvVar3->data[uVar10] = 0;
  pvVar3->size = uVar10 + 1;
  pvVar4 = s->levels;
  uVar10 = pvVar4->cap;
  if (pvVar4->size == uVar10) {
    if (uVar10 < 0x10) {
      puVar8 = (uint *)realloc(pvVar4->data,0x40);
      pvVar4->data = puVar8;
      uVar10 = 0x10;
      if (puVar8 != (uint *)0x0) {
LAB_005550d4:
        pvVar4->cap = uVar10;
        goto LAB_005550d7;
      }
    }
    else {
      if ((int)uVar10 < 1) goto LAB_005550d7;
      puVar8 = (uint *)realloc(pvVar4->data,(ulong)uVar10 * 8);
      pvVar4->data = puVar8;
      if (puVar8 != (uint *)0x0) {
        uVar10 = uVar10 * 2;
        goto LAB_005550d4;
      }
    }
    goto LAB_005553af;
  }
LAB_005550d7:
  pvVar4->data[pvVar4->size] = 0;
  pvVar4->size = pvVar4->size + 1;
  pvVar5 = s->assigns;
  uVar10 = pvVar5->cap;
  if (pvVar5->size == uVar10) {
    if (uVar10 < 0x10) {
      pcVar9 = (char *)realloc(pvVar5->data,0x10);
      pvVar5->data = pcVar9;
      sVar11 = 0x10;
    }
    else {
      if ((int)uVar10 < 1) goto LAB_00555142;
      sVar11 = (ulong)uVar10 * 2;
      pcVar9 = (char *)realloc(pvVar5->data,sVar11);
      pvVar5->data = pcVar9;
    }
    if (pcVar9 != (char *)0x0) {
      pvVar5->cap = (uint)sVar11;
      goto LAB_00555142;
    }
  }
  else {
LAB_00555142:
    pvVar5->data[pvVar5->size] = '\x03';
    pvVar5->size = pvVar5->size + 1;
    pvVar5 = s->polarity;
    uVar10 = pvVar5->cap;
    if (pvVar5->size == uVar10) {
      if (uVar10 < 0x10) {
        pcVar9 = (char *)realloc(pvVar5->data,0x10);
        pvVar5->data = pcVar9;
        sVar11 = 0x10;
      }
      else {
        if ((int)uVar10 < 1) goto LAB_005551ad;
        sVar11 = (ulong)uVar10 * 2;
        pcVar9 = (char *)realloc(pvVar5->data,sVar11);
        pvVar5->data = pcVar9;
      }
      if (pcVar9 == (char *)0x0) goto LAB_00555398;
      pvVar5->cap = (uint)sVar11;
    }
LAB_005551ad:
    pvVar5->data[pvVar5->size] = sign;
    pvVar5->size = pvVar5->size + 1;
    pvVar4 = s->reasons;
    uVar10 = pvVar4->cap;
    if (pvVar4->size == uVar10) {
      if (uVar10 < 0x10) {
        puVar8 = (uint *)realloc(pvVar4->data,0x40);
        pvVar4->data = puVar8;
        uVar10 = 0x10;
        if (puVar8 != (uint *)0x0) {
LAB_0055521b:
          pvVar4->cap = uVar10;
          goto LAB_0055521e;
        }
      }
      else {
        if ((int)uVar10 < 1) goto LAB_0055521e;
        puVar8 = (uint *)realloc(pvVar4->data,(ulong)uVar10 * 8);
        pvVar4->data = puVar8;
        if (puVar8 != (uint *)0x0) {
          uVar10 = uVar10 * 2;
          goto LAB_0055521b;
        }
      }
LAB_005553af:
      __file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
      ;
      pcVar9 = "void vec_uint_reserve(vec_uint_t *, unsigned int)";
      goto LAB_005553db;
    }
LAB_0055521e:
    pvVar4->data[pvVar4->size] = 0xffffffff;
    pvVar4->size = pvVar4->size + 1;
    pvVar4 = s->stamps;
    uVar10 = pvVar4->cap;
    if (pvVar4->size == uVar10) {
      if (uVar10 < 0x10) {
        puVar8 = (uint *)realloc(pvVar4->data,0x40);
        pvVar4->data = puVar8;
        uVar10 = 0x10;
        if (puVar8 == (uint *)0x0) goto LAB_005553af;
      }
      else {
        if ((int)uVar10 < 1) goto LAB_00555292;
        puVar8 = (uint *)realloc(pvVar4->data,(ulong)uVar10 * 8);
        pvVar4->data = puVar8;
        if (puVar8 == (uint *)0x0) goto LAB_005553af;
        uVar10 = uVar10 * 2;
      }
      pvVar4->cap = uVar10;
    }
LAB_00555292:
    pvVar4->data[pvVar4->size] = 0;
    pvVar4->size = pvVar4->size + 1;
    pvVar5 = s->seen;
    uVar10 = pvVar5->cap;
    if (pvVar5->size == uVar10) {
      if (uVar10 < 0x10) {
        pcVar9 = (char *)realloc(pvVar5->data,0x10);
        pvVar5->data = pcVar9;
        sVar11 = 0x10;
      }
      else {
        if ((int)uVar10 < 1) goto LAB_00555300;
        sVar11 = (ulong)uVar10 * 2;
        pcVar9 = (char *)realloc(pvVar5->data,sVar11);
        pvVar5->data = pcVar9;
      }
      if (pcVar9 == (char *)0x0) goto LAB_00555398;
      pvVar5->cap = (uint)sVar11;
    }
LAB_00555300:
    pvVar5->data[pvVar5->size] = '\0';
    pvVar5->size = pvVar5->size + 1;
    heap_insert(s->var_order,entry);
    pvVar5 = s->marks;
    if (pvVar5 == (vec_char_t *)0x0) {
      return entry;
    }
    uVar10 = pvVar5->cap;
    if (pvVar5->size != uVar10) {
LAB_00555377:
      pvVar5->data[pvVar5->size] = '\0';
      pvVar5->size = pvVar5->size + 1;
      return entry;
    }
    if (uVar10 < 0x10) {
      pcVar9 = (char *)realloc(pvVar5->data,0x10);
      pvVar5->data = pcVar9;
      sVar11 = 0x10;
    }
    else {
      if ((int)uVar10 < 1) goto LAB_00555377;
      sVar11 = (ulong)uVar10 * 2;
      pcVar9 = (char *)realloc(pvVar5->data,sVar11);
      pvVar5->data = pcVar9;
    }
    if (pcVar9 != (char *)0x0) {
      pvVar5->cap = (uint)sVar11;
      goto LAB_00555377;
    }
  }
LAB_00555398:
  __file = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_char.h"
  ;
  pcVar9 = "void vec_char_reserve(vec_char_t *, unsigned int)";
LAB_005553db:
  __assert_fail("p->data != NULL",__file,0x6e,pcVar9);
}

Assistant:

int satoko_add_variable(solver_t *s, char sign)
{
    unsigned var = vec_act_size(s->activity);
    vec_wl_push(s->watches);
    vec_wl_push(s->watches);
    vec_act_push_back(s->activity, 0);
    vec_uint_push_back(s->levels, 0);
    vec_char_push_back(s->assigns, SATOKO_VAR_UNASSING);
    vec_char_push_back(s->polarity, sign);
    vec_uint_push_back(s->reasons, UNDEF);
    vec_uint_push_back(s->stamps, 0);
    vec_char_push_back(s->seen, 0);
    heap_insert(s->var_order, var);
    if (s->marks)
        vec_char_push_back(s->marks, 0);
    return var;
}